

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O3

void gravity_compiler_reset(gravity_compiler_t *compiler,_Bool free_core)

{
  cstring_r **ppcVar1;
  size_t sVar2;
  char *__ptr;
  cstring_r *__ptr_00;
  void_r *__ptr_01;
  ulong uVar3;
  
  ppcVar1 = &compiler->storage;
  __ptr_00 = compiler->storage;
  if (__ptr_00 != (cstring_r *)0x0) {
    sVar2 = __ptr_00->n;
    if (sVar2 != 0) {
      uVar3 = 0;
      do {
        if (uVar3 < (*ppcVar1)->n) {
          __ptr = (*ppcVar1)->p[uVar3];
        }
        else {
          __ptr = (char *)0x0;
        }
        free(__ptr);
        uVar3 = uVar3 + 1;
      } while (sVar2 != uVar3);
      __ptr_00 = *ppcVar1;
    }
    if (__ptr_00->p != (char **)0x0) {
      free(__ptr_00->p);
      __ptr_00 = *ppcVar1;
    }
    free(__ptr_00);
  }
  if (compiler->ast != (gnode_t *)0x0) {
    gnode_free(compiler->ast);
  }
  if (compiler->parser != (gravity_parser_t *)0x0) {
    gravity_parser_free(compiler->parser);
  }
  if (compiler->vm != (gravity_vm *)0x0) {
    gravity_vm_free(compiler->vm);
  }
  __ptr_01 = compiler->objects;
  if (__ptr_01 != (void_r *)0x0) {
    if (__ptr_01->p != (void **)0x0) {
      free(__ptr_01->p);
      __ptr_01 = compiler->objects;
    }
    free(__ptr_01);
  }
  if (free_core) {
    gravity_core_free();
  }
  compiler->parser = (gravity_parser_t *)0x0;
  compiler->ast = (gnode_t *)0x0;
  compiler->objects = (void_r *)0x0;
  *ppcVar1 = (cstring_r *)0x0;
  compiler->vm = (gravity_vm *)0x0;
  return;
}

Assistant:

static void gravity_compiler_reset (gravity_compiler_t *compiler, bool free_core) {
    // free memory for array of strings storage
    if (compiler->storage) {
        cstring_array_each(compiler->storage, {mem_free((void *)val);});
        gnode_array_free(compiler->storage);
    }

    // first ast then parser, don't change the release order
    if (compiler->ast) gnode_free(compiler->ast);
    if (compiler->parser) gravity_parser_free(compiler->parser);

    // at the end free mini VM and objects array
    if (compiler->vm) gravity_vm_free(compiler->vm);
    if (compiler->objects) {
        marray_destroy(*compiler->objects);
        mem_free((void*)compiler->objects);
    }

    // feel free to free core if someone requires it
    if (free_core) gravity_core_free();

    // reset internal pointers
    compiler->vm = NULL;
    compiler->ast = NULL;
    compiler->parser = NULL;
    compiler->objects = NULL;
    compiler->storage = NULL;
}